

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
          (cmCPackPropertiesGenerator *this,cmMakefile *mf,cmInstalledFile *installedFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  allocator local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  cmInstalledFile *installedFile_local;
  cmMakefile *mf_local;
  cmCPackPropertiesGenerator *this_local;
  
  local_28 = configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)installedFile;
  installedFile_local = (cmInstalledFile *)mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CPACK_BUILD_CONFIG",&local_49);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmCPackPropertiesGenerator_00c1cc50;
  this->Makefile = (cmMakefile *)installedFile_local;
  this->InstalledFile = (cmInstalledFile *)configurations_local;
  (this->super_cmScriptGenerator).ActionsPerConfig = true;
  return;
}

Assistant:

cmCPackPropertiesGenerator::cmCPackPropertiesGenerator(
  cmMakefile* mf,
  cmInstalledFile const& installedFile,
  std::vector<std::string> const& configurations):
    cmScriptGenerator("CPACK_BUILD_CONFIG", configurations),
    Makefile(mf),
    InstalledFile(installedFile)
{
  this->ActionsPerConfig = true;
}